

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distribution.cpp
# Opt level: O1

void __thiscall Distribution::Distribution(Distribution *this)

{
  uint uVar1;
  long lVar2;
  size_t __i;
  ulong uVar3;
  random_device rd;
  random_device local_2730;
  ulong local_13a8 [624];
  undefined8 local_28;
  
  this->_vptr_Distribution = (_func_int **)&PTR___cxa_pure_virtual_0010bd00;
  std::random_device::random_device(&this->rd);
  (this->distrib)._M_param._M_a = 0.0;
  (this->distrib)._M_param._M_b = 1.0;
  (this->gen)._M_x[0] = 0x1571;
  uVar3 = 0x1571;
  lVar2 = 0;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2 + 1);
    (this->gen)._M_x[lVar2 + 1] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x26f);
  (this->gen)._M_p = 0x270;
  std::random_device::random_device(&local_2730);
  uVar1 = std::random_device::_M_getval();
  local_13a8[0] = (ulong)uVar1;
  lVar2 = 1;
  uVar3 = local_13a8[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_13a8[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_28 = 0x270;
  memcpy(&this->gen,local_13a8,5000);
  (this->distrib)._M_param._M_a = 0.0;
  (this->distrib)._M_param._M_b = 1.0;
  std::random_device::_M_fini();
  return;
}

Assistant:

Distribution::Distribution() {
	std::random_device rd;		//Will be used to obtain a seed for the random number engine
	gen = std::mt19937 (rd());	//Standard mersenne_twister_engine seeded with rd()
	distrib = std::uniform_real_distribution<> (0,1);
}